

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::unsetCursor(QWidget *this)

{
  bool bVar1;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QEvent event;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  pointer in_stack_ffffffffffffffc8;
  QEvent *this_00;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36dbda);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36dbed);
  if (bVar1) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36dc01);
    std::unique_ptr<QCursor,_std::default_delete<QCursor>_>::reset
              ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)in_RDI,
               in_stack_ffffffffffffffc8);
  }
  bVar1 = isWindow((QWidget *)in_RDI);
  if (!bVar1) {
    setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
  }
  QWidgetPrivate::unsetCursor_sys(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QEvent *)&local_18;
  QEvent::QEvent(this_00,CursorChange);
  QCoreApplication::sendEvent((QObject *)in_RDI,this_00);
  QEvent::~QEvent(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::unsetCursor()
{
    Q_D(QWidget);
    if (d->extra)
        d->extra->curs.reset();
    if (!isWindow())
        setAttribute(Qt::WA_SetCursor, false);
    d->unsetCursor_sys();

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}